

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

void __thiscall
TwoStageDynamicBayesianNetwork::ComputeWithinNextStageClosure
          (TwoStageDynamicBayesianNetwork *this,Scope *Y,Scope *O)

{
  bool bVar1;
  reference puVar2;
  Scope *in_RDX;
  Scope *in_RSI;
  const_iterator oo_it;
  Scope *o_OSoI;
  const_iterator oy_it_1;
  Scope *o_YSoI;
  Index oI;
  const_iterator o_last;
  const_iterator o_it;
  const_iterator oy_it;
  Scope *y_YSoI;
  Index yI;
  const_iterator s_last;
  const_iterator s_it;
  bool converged;
  Scope *in_stack_fffffffffffffee8;
  Scope *in_stack_fffffffffffffef0;
  Scope *in_stack_fffffffffffffef8;
  Scope *in_stack_ffffffffffffff08;
  Scope *in_stack_ffffffffffffff10;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  const_reference local_c0;
  uint *local_b8;
  uint *local_b0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a8;
  const_reference local_a0;
  uint local_94;
  uint *local_90;
  uint *local_80;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_reference local_50;
  uint local_44;
  uint *local_40;
  uint *local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  byte local_19;
  Scope *local_18;
  Scope *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    local_19 = 1;
    local_30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&in_stack_fffffffffffffee8->super_SDT);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffee8);
    local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (&in_stack_fffffffffffffee8->super_SDT);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_28);
      local_44 = *puVar2;
      local_50 = std::vector<Scope,_std::allocator<Scope>_>::at
                           ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffef0,
                            (size_type)in_stack_fffffffffffffee8);
      local_58._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&in_stack_fffffffffffffee8->super_SDT);
      while( true ) {
        local_60 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     (&in_stack_fffffffffffffee8->super_SDT);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        in_stack_ffffffffffffff10 = local_10;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator*(&local_58);
        bVar1 = Scope::Contains(in_stack_ffffffffffffff10,
                                (Index)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        if (!bVar1) {
          local_19 = 0;
          in_stack_ffffffffffffff08 = local_10;
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator*(&local_58);
          Scope::Insert(in_stack_fffffffffffffef0,(Index)((ulong)in_stack_fffffffffffffee8 >> 0x20))
          ;
        }
        local_68 = (uint *)__gnu_cxx::
                           __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)in_stack_fffffffffffffef8,
                                        (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      }
      local_70 = (uint *)__gnu_cxx::
                         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffffef8,
                                      (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
    local_80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&in_stack_fffffffffffffee8->super_SDT);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffee8);
    local_90 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (&in_stack_fffffffffffffee8->super_SDT);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffef0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_78);
      local_94 = *puVar2;
      local_a0 = std::vector<Scope,_std::allocator<Scope>_>::at
                           ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffef0,
                            (size_type)in_stack_fffffffffffffee8);
      local_a8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&in_stack_fffffffffffffee8->super_SDT);
      while( true ) {
        local_b0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     (&in_stack_fffffffffffffee8->super_SDT);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator*(&local_a8);
        bVar1 = Scope::Contains(in_stack_ffffffffffffff10,
                                (Index)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        if (!bVar1) {
          local_19 = 0;
          in_stack_fffffffffffffef8 = local_10;
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator*(&local_a8);
          Scope::Insert(in_stack_fffffffffffffef0,(Index)((ulong)in_stack_fffffffffffffee8 >> 0x20))
          ;
        }
        local_b8 = (uint *)__gnu_cxx::
                           __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)in_stack_fffffffffffffef8,
                                        (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      }
      local_c0 = std::vector<Scope,_std::allocator<Scope>_>::at
                           ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffef0,
                            (size_type)in_stack_fffffffffffffee8);
      local_c8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&in_stack_fffffffffffffee8->super_SDT);
      while( true ) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  (&in_stack_fffffffffffffee8->super_SDT);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        in_stack_fffffffffffffef0 = local_18;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator*(&local_c8);
        bVar1 = Scope::Contains(in_stack_ffffffffffffff10,
                                (Index)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        if (!bVar1) {
          local_19 = 0;
          in_stack_fffffffffffffee8 = local_18;
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator*(&local_c8);
          Scope::Insert(in_stack_fffffffffffffef0,(Index)((ulong)in_stack_fffffffffffffee8 >> 0x20))
          ;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    *)in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
  } while (((local_19 ^ 0xff) & 1) != 0);
  return;
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ComputeWithinNextStageClosure(Scope& Y, Scope& O) const
{    
    bool converged = true;
    do{
        converged = true;
        //check all Y for non-included Y dependencies
        Scope::const_iterator s_it = Y.begin();
        Scope::const_iterator s_last = Y.end();
        while(s_it != s_last)
        {
            Index yI = *s_it;
            const Scope& y_YSoI = _m_YSoI_Y.at(yI);
            for(Scope::const_iterator oy_it = y_YSoI.begin(); 
                    oy_it != y_YSoI.end(); oy_it++)
                //yI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }
            s_it++;
        }
        
        //check all O for non-included O and Y dependencies
        Scope::const_iterator o_it = O.begin();
        Scope::const_iterator o_last = O.end();
        while(o_it != o_last)
        {
            Index oI = *o_it;
            const Scope& o_YSoI = _m_YSoI_O.at(oI);
            for(Scope::const_iterator oy_it = o_YSoI.begin(); 
                oy_it != o_YSoI.end(); oy_it++)
                //oI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }

            const Scope& o_OSoI = _m_OSoI_O.at(oI);
            for(Scope::const_iterator oo_it = o_OSoI.begin(); 
                oo_it != o_OSoI.end(); oo_it++)
                //oI has other O (ooI = *oo_it) that point to it...
                //let's see if they are in O already.
                if(! O.Contains( *oo_it ) )
                {
                    converged = false;
                    O.Insert(*oo_it);
                }


            o_it++;
        }

    }while (! converged );
}